

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Array<const_char> * __thiscall
capnp::SchemaFile::DiskSchemaFile::readContent
          (Array<const_char> *__return_storage_ptr__,DiskSchemaFile *this)

{
  ReadableFile *pRVar1;
  ReadableFile *pRVar2;
  undefined1 local_60 [8];
  undefined8 local_58;
  Array<const_unsigned_char> local_30;
  DiskSchemaFile *local_18;
  DiskSchemaFile *this_local;
  
  local_18 = this;
  this_local = (DiskSchemaFile *)__return_storage_ptr__;
  pRVar1 = kj::Own<const_kj::ReadableFile,_std::nullptr_t>::operator->(&this->file);
  pRVar2 = kj::Own<const_kj::ReadableFile,_std::nullptr_t>::operator->(&this->file);
  (*(pRVar2->super_FsNode)._vptr_FsNode[2])(local_60);
  (*(pRVar1->super_FsNode)._vptr_FsNode[7])(&local_30,pRVar1,0,local_58);
  kj::Array<const_unsigned_char>::releaseAsChars(__return_storage_ptr__,&local_30);
  kj::Array<const_unsigned_char>::~Array(&local_30);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<const char> readContent() const override {
    return file->mmap(0, file->stat().size).releaseAsChars();
  }